

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_generator_testing.h
# Opt level: O0

mt19937_64 * phmap::priv::hash_internal::GetSharedRng(void)

{
  int iVar1;
  mt19937_64 *pmVar2;
  undefined1 local_1390 [8];
  RandomDeviceSeedSeq seed_seq;
  
  anon_unknown_3::RandomDeviceSeedSeq::RandomDeviceSeedSeq((RandomDeviceSeedSeq *)local_1390);
  if (GetSharedRng()::rng == '\0') {
    iVar1 = __cxa_guard_acquire(&GetSharedRng()::rng);
    if (iVar1 != 0) {
      pmVar2 = (mt19937_64 *)operator_new(0x9c8);
      std::
      mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>
      ::
      mersenne_twister_engine<phmap::priv::hash_internal::(anonymous_namespace)::RandomDeviceSeedSeq,void>
                ((mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>
                  *)pmVar2,(RandomDeviceSeedSeq *)local_1390);
      GetSharedRng::rng = pmVar2;
      __cxa_guard_release(&GetSharedRng()::rng);
    }
  }
  pmVar2 = GetSharedRng::rng;
  anon_unknown_3::RandomDeviceSeedSeq::~RandomDeviceSeedSeq((RandomDeviceSeedSeq *)local_1390);
  return pmVar2;
}

Assistant:

std::mt19937_64* GetSharedRng() {
    RandomDeviceSeedSeq seed_seq;
    static auto* rng = new std::mt19937_64(seed_seq);
    return rng;
}